

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int attrset_read_attr_set_v1(BigAttrSet *attrset,char *basename)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  undefined4 nmemb_00;
  int iVar4;
  FILE *__stream;
  size_t sVar5;
  char *__ptr;
  char *pcVar6;
  undefined1 auStack_58 [4];
  int local_54;
  char *pcStack_50;
  int ldata;
  char *name;
  char *data;
  char dtype [9];
  int lname;
  int nmemb;
  FILE *fattr;
  char *basename_local;
  BigAttrSet *attrset_local;
  
  attrset->dirty = 0;
  __stream = (FILE *)_big_file_open_a_file(basename,-2,"r",0);
  if (__stream == (FILE *)0x0) {
    attrset_local._4_4_ = 0;
  }
  else {
    memset((void *)((long)&data + 7),0,9);
    pcVar6 = auStack_58;
    do {
      builtin_strncpy(pcVar6 + -8,"Q:\x10",4);
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      iVar4 = feof(__stream);
      if (iVar4 != 0) {
LAB_00103bf1:
        attrset->dirty = 0;
        builtin_strncpy(pcVar6 + -8,"\x04<\x10",4);
        pcVar6[-4] = '\0';
        pcVar6[-3] = '\0';
        pcVar6[-2] = '\0';
        pcVar6[-1] = '\0';
        fclose(__stream);
        return 0;
      }
      builtin_strncpy(pcVar6 + -8,"y:\x10",4);
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      sVar5 = fread(dtype + 5,4,1,__stream);
      if (sVar5 != 1) goto LAB_00103bf1;
      pcVar6[-8] = -0x5e;
      pcVar6[-7] = ':';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      sVar5 = fread(dtype + 1,4,1,__stream);
      if (sVar5 != 1) {
LAB_00103ae1:
        pcVar6[-8] = -5;
        pcVar6[-7] = ':';
        pcVar6[-6] = '\x10';
        pcVar6[-5] = '\0';
        pcVar6[-4] = '\0';
        pcVar6[-3] = '\0';
        pcVar6[-2] = '\0';
        pcVar6[-1] = '\0';
        _big_file_raise("Failed to read from file",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                        ,0x5b0);
        __ptr = pcVar6;
        goto LAB_00103c0f;
      }
      pcVar6[-8] = -0x3a;
      pcVar6[-7] = ':';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      sVar5 = fread((void *)((long)&data + 7),8,1,__stream);
      if (sVar5 != 1) goto LAB_00103ae1;
      pcVar6[-8] = -0x24;
      pcVar6[-7] = ':';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      iVar4 = dtype_isvalid((char *)((long)&data + 7));
      if (iVar4 == 0) goto LAB_00103ae1;
      builtin_strncpy(pcVar6 + -8,"\t;\x10",4);
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      local_54 = big_file_dtype_itemsize((char *)((long)&data + 7));
      local_54 = local_54 * dtype._5_4_;
      lVar1 = -((long)local_54 + 0xfU & 0xfffffffffffffff0);
      name = pcVar6 + lVar1;
      lVar2 = -((long)(int)dtype._1_4_ + 0x10U & 0xfffffffffffffff0);
      __ptr = name + lVar2;
      sVar5 = (size_t)(int)dtype._1_4_;
      pcStack_50 = __ptr;
      builtin_strncpy(pcVar6 + lVar2 + lVar1 + -8,"Z;\x10",4);
      __ptr[-4] = '\0';
      __ptr[-3] = '\0';
      __ptr[-2] = '\0';
      __ptr[-1] = '\0';
      sVar5 = fread(__ptr,sVar5,1,__stream);
      pcVar3 = name;
      if (sVar5 != 1) {
LAB_00103b8a:
        __ptr[-8] = -0x5c;
        __ptr[-7] = ';';
        __ptr[-6] = '\x10';
        __ptr[-5] = '\0';
        __ptr[-4] = '\0';
        __ptr[-3] = '\0';
        __ptr[-2] = '\0';
        __ptr[-1] = '\0';
        _big_file_raise("Failed to read from file",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                        ,0x5b8);
        goto LAB_00103c0f;
      }
      sVar5 = (size_t)local_54;
      builtin_strncpy(pcVar6 + lVar2 + lVar1 + -8,"};\x10",4);
      __ptr[-4] = '\0';
      __ptr[-3] = '\0';
      __ptr[-2] = '\0';
      __ptr[-1] = '\0';
      sVar5 = fread(pcVar3,sVar5,1,__stream);
      nmemb_00 = dtype._5_4_;
      pcVar3 = name;
      pcVar6 = pcStack_50;
      if (sVar5 != 1) goto LAB_00103b8a;
      pcStack_50[(int)dtype._1_4_] = '\0';
      __ptr[-8] = -0x35;
      __ptr[-7] = ';';
      __ptr[-6] = '\x10';
      __ptr[-5] = '\0';
      __ptr[-4] = '\0';
      __ptr[-3] = '\0';
      __ptr[-2] = '\0';
      __ptr[-1] = '\0';
      iVar4 = attrset_set_attr(attrset,pcVar6,pcVar3,(char *)((long)&data + 7),nmemb_00);
      pcVar6 = __ptr;
    } while (iVar4 == 0);
    __ptr[-8] = -0x16;
    __ptr[-7] = ';';
    __ptr[-6] = '\x10';
    __ptr[-5] = '\0';
    __ptr[-4] = '\0';
    __ptr[-3] = '\0';
    __ptr[-2] = '\0';
    __ptr[-1] = '\0';
    _big_file_raise((char *)0x0,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x5bd);
LAB_00103c0f:
    attrset->dirty = 0;
    builtin_strncpy(__ptr + -8,"\"<\x10",4);
    __ptr[-4] = '\0';
    __ptr[-3] = '\0';
    __ptr[-2] = '\0';
    __ptr[-1] = '\0';
    fclose(__stream);
    attrset_local._4_4_ = -1;
  }
  return attrset_local._4_4_;
}

Assistant:

static int
attrset_read_attr_set_v1(BigAttrSet * attrset, const char * basename)
{
    attrset->dirty = 0;

    FILE * fattr = _big_file_open_a_file(basename, FILEID_ATTR, "r", 0);
    if(fattr == NULL) {
        return 0;
    }
    int nmemb;
    int lname;
    char dtype[9]={0};
    char * data;
    char * name;
    while(!feof(fattr)) {
        if(1 != fread(&nmemb, sizeof(int), 1, fattr)) break;
        RAISEIF(
            (1 != fread(&lname, sizeof(int), 1, fattr)) ||
            (1 != fread(&dtype, 8, 1, fattr)) ||
            (!dtype_isvalid(dtype)),
            ex_fread,
            "Failed to read from file"
                )
        int ldata = big_file_dtype_itemsize(dtype) * nmemb;
        data = alloca(ldata);
        name = alloca(lname + 1);
        RAISEIF(
            (1 != fread(name, lname, 1, fattr)) ||
            (1 != fread(data, ldata, 1, fattr)),
            ex_fread,
            "Failed to read from file");

        name[lname] = 0;
        RAISEIF(0 != attrset_set_attr(attrset, name, data, dtype, nmemb),
            ex_set_attr,
            NULL);
    }
    attrset->dirty = 0;
    fclose(fattr);
    return 0;
ex_set_attr:
ex_fread:
    attrset->dirty = 0;
    fclose(fattr);
    return -1;
}